

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O3

void __thiscall QToolBarLayout::setUsePopupMenu(QToolBarLayout *this,bool set)

{
  QMenu *this_00;
  long in_FS_OFFSET;
  Connection CStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->dirty == false) && ((this->popupMenu != (QMenu *)0x0) != set)) {
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  }
  if (set) {
    QObject::disconnect((QObject *)this->extension,"2clicked(bool)",(QObject *)this,
                        "1setExpanded(bool)");
    QToolButton::setPopupMode(&this->extension->super_QToolButton,InstantPopup);
    this_00 = this->popupMenu;
    if (this_00 == (QMenu *)0x0) {
      this_00 = (QMenu *)operator_new(0x28);
      QMenu::QMenu(this_00,(QWidget *)this->extension);
      this->popupMenu = this_00;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QToolButton::setMenu(&this->extension->super_QToolButton,this_00);
      return;
    }
  }
  else {
    QObject::connect((QObject *)&CStack_28,(char *)this->extension,(QObject *)"2clicked(bool)",
                     (char *)this,0x6e1f35);
    QMetaObject::Connection::~Connection(&CStack_28);
    QToolButton::setPopupMode(&this->extension->super_QToolButton,DelayedPopup);
    QToolButton::setMenu(&this->extension->super_QToolButton,(QMenu *)0x0);
    if (this->popupMenu != (QMenu *)0x0) {
      (**(code **)(*(long *)&this->popupMenu->super_QWidget + 0x20))();
    }
    this->popupMenu = (QMenu *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::setUsePopupMenu(bool set)
{
    if (!dirty && ((popupMenu == nullptr) == set))
        invalidate();
    if (!set) {
        QObject::connect(extension, SIGNAL(clicked(bool)),
                        this, SLOT(setExpanded(bool)), Qt::UniqueConnection);
        extension->setPopupMode(QToolButton::DelayedPopup);
        extension->setMenu(nullptr);
        delete popupMenu;
        popupMenu = nullptr;
    } else {
        QObject::disconnect(extension, SIGNAL(clicked(bool)),
                            this, SLOT(setExpanded(bool)));
        extension->setPopupMode(QToolButton::InstantPopup);
        if (!popupMenu) {
            popupMenu = new QMenu(extension);
        }
        extension->setMenu(popupMenu);
    }
}